

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layout.c++
# Opt level: O0

SegmentAnd<capnp::word_*>
capnp::_::WireHelpers::setListPointer
          (SegmentBuilder *segment,CapTableBuilder *capTable,WirePointer *ref,ListReader value,
          BuilderArena *orphanArena,bool canonical)

{
  SegmentAnd<capnp::word_*> SVar1;
  ushort uVar2;
  StructPointerCount SVar3;
  unsigned_short uVar4;
  bool bVar5;
  WiderType<Decay<unsigned_short_&>,_Decay<unsigned_int>_> WVar6;
  unsigned_long uVar7;
  WordCount64 value_00;
  WirePointer *pWVar8;
  uint *puVar9;
  uchar *puVar10;
  uchar *puVar11;
  ptrdiff_t pVar12;
  WiderType<Decay<unsigned_short_&>,_Decay<long>_> WVar13;
  ulong uVar14;
  unsigned_short *puVar15;
  bool local_1f1;
  Iterator local_1a8;
  Iterator local_1a6;
  Range<unsigned_short> RStack_1a4;
  unsigned_short j;
  Iterator __end4_2;
  Iterator __begin4_2;
  Range<unsigned_short> *__range4_2;
  Iterator local_190;
  uint i_2;
  Iterator __end3;
  Iterator __begin3;
  Range<unsigned_int> *__range3;
  word *src;
  word *dst;
  WirePointer *tag;
  word *ptr_1;
  Fault f_1;
  Fault local_140;
  Fault f;
  unsigned_long newTotalSize;
  WirePointer *local_128;
  WirePointer *ptr_2;
  uchar *local_118;
  uchar *end;
  ArrayPtr<const_unsigned_char> data;
  StructReader element;
  Iterator local_c8;
  uint i_1;
  Iterator __end4_1;
  Iterator __begin4_1;
  Range<unsigned_int> *__range4_1;
  unsigned_short local_a8;
  StructPointerCount local_a6;
  ushort local_a4;
  StructPointerCount ptrCount;
  StructDataWordCount dataSize;
  StructPointerCount declPointerCount;
  StructDataWordCount declDataSize;
  uint8_t mask;
  unsigned_long leftoverBits;
  unsigned_long local_90;
  unsigned_long wholeByteSize;
  uint local_74;
  Iterator local_70;
  uint i;
  Iterator __end4;
  Iterator __begin4;
  Range<unsigned_int> *__range4;
  word *ptr;
  Exception *local_48;
  unsigned_long totalSize;
  BuilderArena *pBStack_38;
  bool canonical_local;
  BuilderArena *orphanArena_local;
  WirePointer *ref_local;
  CapTableBuilder *capTable_local;
  SegmentBuilder *segment_local;
  WirePointer *local_10;
  
  totalSize._7_1_ = canonical;
  pBStack_38 = orphanArena;
  orphanArena_local = (BuilderArena *)ref;
  ref_local = (WirePointer *)capTable;
  capTable_local = (CapTableBuilder *)segment;
  uVar7 = upgradeBound<unsigned_long,unsigned_int>(value.elementCount);
  value_00 = roundBitsUpToWords(uVar7 * value.step);
  local_48 = (Exception *)
             assertMax<536870910u,unsigned_long,capnp::_::WireHelpers::setListPointer(capnp::_::SegmentBuilder*,capnp::_::CapTableBuilder*,capnp::_::WirePointer*,capnp::_::ListReader,capnp::_::BuilderArena*,bool)::_lambda()_1_>
                       (value_00,(anon_class_1_0_00000001 *)((long)&ptr + 7));
  if (value.elementSize == INLINE_COMPOSITE) {
    local_a4 = (ushort)(value.structDataSize >> 6);
    local_a6 = value.structPointerCount;
    local_a8 = 0;
    __range4_1._6_2_ = 0;
    SVar3 = local_a6;
    uVar4 = local_a4;
    if ((totalSize._7_1_ & 1) != 0) {
      ___end4_1 = kj::zeroTo<unsigned_int>(value.elementCount);
      i_1 = (uint)kj::Range<unsigned_int>::begin((Range<unsigned_int> *)&__end4_1);
      local_c8 = kj::Range<unsigned_int>::end((Range<unsigned_int> *)&__end4_1);
      while (bVar5 = kj::Range<unsigned_int>::Iterator::operator!=((Iterator *)&i_1,&local_c8),
            bVar5) {
        puVar9 = kj::Range<unsigned_int>::Iterator::operator*((Iterator *)&i_1);
        ListReader::getStructElement((StructReader *)&data.size_,&value,*puVar9);
        _end = StructReader::getDataSectionAsBlob((StructReader *)&data.size_);
        local_118 = kj::ArrayPtr<const_unsigned_char>::end((ArrayPtr<const_unsigned_char> *)&end);
        while( true ) {
          puVar11 = local_118;
          puVar10 = kj::ArrayPtr<const_unsigned_char>::begin((ArrayPtr<const_unsigned_char> *)&end);
          bVar5 = false;
          if (puVar10 < puVar11) {
            bVar5 = local_118[-1] == '\0';
          }
          if (!bVar5) break;
          local_118 = local_118 + -1;
        }
        puVar11 = kj::ArrayPtr<const_unsigned_char>::begin((ArrayPtr<const_unsigned_char> *)&end);
        pVar12 = intervalLength<unsigned_char>(puVar11,local_118,0x7fff8);
        ptr_2._4_4_ = roundBytesUpToWords((ByteCount)pVar12);
        WVar6 = kj::max<unsigned_short&,unsigned_int>(&local_a8,(uint *)((long)&ptr_2 + 4));
        local_a8 = (unsigned_short)WVar6;
        local_128 = (WirePointer *)
                    ((long)element.data + (long)(int)(uint)element.pointers._4_2_ * 8);
        while( true ) {
          local_1f1 = false;
          if (element.data < local_128) {
            local_1f1 = WirePointer::isNull(local_128 + -1);
          }
          if (local_1f1 == false) break;
          local_128 = local_128 + -1;
        }
        newTotalSize = intervalLength<capnp::_::WirePointer>
                                 ((WirePointer *)element.data,local_128,0xffff);
        WVar13 = kj::max<unsigned_short&,long>
                           ((unsigned_short *)((long)&__range4_1 + 6),(long *)&newTotalSize);
        __range4_1._6_2_ = (unsigned_short)WVar13;
        kj::Range<unsigned_int>::Iterator::operator++((Iterator *)&i_1);
      }
      uVar14 = (ulong)local_a8;
      uVar7 = upgradeBound<unsigned_long,unsigned_short>(__range4_1._6_2_);
      f.exception = (Exception *)((uVar14 + uVar7) * (ulong)value.elementCount);
      if (local_48 < f.exception) {
        kj::_::Debug::Fault::Fault
                  (&local_140,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/layout.c++"
                   ,0x757,FAILED,"newTotalSize <= totalSize","");
        kj::_::Debug::Fault::fatal(&local_140);
      }
      local_48 = (Exception *)assumeMax<536870910ul,unsigned_long>((unsigned_long)f.exception);
      SVar3 = __range4_1._6_2_;
      uVar4 = local_a8;
    }
    local_a8 = uVar4;
    __range4_1._6_2_ = SVar3;
    if (((undefined1  [20])value._28_20_ & (undefined1  [20])0x3f00000000) != (undefined1  [20])0x0)
    {
      kj::_::Debug::Fault::Fault
                ((Fault *)&ptr_1,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/layout.c++"
                 ,0x75e,FAILED,"value.structDataSize % BITS_PER_WORD == ZERO * BITS","");
      kj::_::Debug::Fault::fatal((Fault *)&ptr_1);
    }
    pWVar8 = (WirePointer *)
             allocate((WirePointer **)&orphanArena_local,(SegmentBuilder **)&capTable_local,
                      (CapTableBuilder *)ref_local,(int)local_48 + 1,LIST,pBStack_38);
    WirePointer::ListRef::setInlineComposite
              ((ListRef *)((long)&(orphanArena_local->super_Arena)._vptr_Arena + 4),
               (WordCountN<29>)local_48);
    WirePointer::setKindAndInlineCompositeListElementCount(pWVar8,STRUCT,value.elementCount);
    WirePointer::StructRef::set(&(pWVar8->field_1).structRef,local_a8,__range4_1._6_2_);
    src = (word *)(pWVar8 + 1);
    __range3 = (Range<unsigned_int> *)value.ptr;
    ___end3 = kj::zeroTo<unsigned_int>(value.elementCount);
    i_2 = (uint)kj::Range<unsigned_int>::begin((Range<unsigned_int> *)&__end3);
    local_190 = kj::Range<unsigned_int>::end((Range<unsigned_int> *)&__end3);
    while (bVar5 = kj::Range<unsigned_int>::Iterator::operator!=((Iterator *)&i_2,&local_190),
          local_10 = pWVar8, bVar5) {
      kj::Range<unsigned_int>::Iterator::operator*((Iterator *)&i_2);
      copyMemory(src,(word *)__range3,(uint)local_a8);
      uVar2 = local_a4;
      uVar4 = local_a8;
      RStack_1a4 = kj::zeroTo<unsigned_short>(__range4_1._6_2_);
      ___end4_2 = &stack0xfffffffffffffe5c;
      local_1a6 = kj::Range<unsigned_short>::begin(___end4_2);
      local_1a8 = kj::Range<unsigned_short>::end(___end4_2);
      while (bVar5 = kj::Range<unsigned_short>::Iterator::operator!=(&local_1a6,&local_1a8), bVar5)
      {
        puVar15 = kj::Range<unsigned_short>::Iterator::operator*(&local_1a6);
        copyPointer((SegmentBuilder *)capTable_local,(CapTableBuilder *)ref_local,
                    (WirePointer *)(src + (long)(int)(uint)uVar4 + (long)(int)(uint)*puVar15),
                    value.segment,value.capTable,
                    (WirePointer *)(__range3 + (long)(int)(uint)uVar2 + (long)(int)(uint)*puVar15),
                    value.nestingLimit,(BuilderArena *)0x0,(bool)(totalSize._7_1_ & 1));
        kj::Range<unsigned_short>::Iterator::operator++(&local_1a6);
      }
      src = src + (long)(int)(uint)uVar4 + (ulong)__range4_1._6_2_;
      __range3 = __range3 + (long)(int)(uint)uVar2 + (ulong)local_a6;
      kj::Range<unsigned_int>::Iterator::operator++((Iterator *)&i_2);
    }
  }
  else {
    pWVar8 = (WirePointer *)
             allocate((WirePointer **)&orphanArena_local,(SegmentBuilder **)&capTable_local,
                      (CapTableBuilder *)ref_local,(SegmentWordCount)local_48,LIST,pBStack_38);
    local_10 = pWVar8;
    if (value.elementSize == POINTER) {
      WirePointer::ListRef::set
                ((ListRef *)((long)&(orphanArena_local->super_Arena)._vptr_Arena + 4),POINTER,
                 value.elementCount);
      ___end4 = kj::zeroTo<unsigned_int>(value.elementCount);
      i = (uint)kj::Range<unsigned_int>::begin((Range<unsigned_int> *)&__end4);
      local_70 = kj::Range<unsigned_int>::end((Range<unsigned_int> *)&__end4);
      while (bVar5 = kj::Range<unsigned_int>::Iterator::operator!=((Iterator *)&i,&local_70), bVar5)
      {
        puVar9 = kj::Range<unsigned_int>::Iterator::operator*((Iterator *)&i);
        local_74 = *puVar9;
        _wholeByteSize =
             copyPointer((SegmentBuilder *)capTable_local,(CapTableBuilder *)ref_local,
                         pWVar8 + local_74,value.segment,value.capTable,
                         (WirePointer *)(value.ptr + (ulong)local_74 * 8),value.nestingLimit,
                         (BuilderArena *)0x0,(bool)(totalSize._7_1_ & 1));
        kj::Range<unsigned_int>::Iterator::operator++((Iterator *)&i);
      }
    }
    else {
      WirePointer::ListRef::set
                ((ListRef *)((long)&(orphanArena_local->super_Arena)._vptr_Arena + 4),
                 value.elementSize,value.elementCount);
      uVar7 = upgradeBound<unsigned_long,unsigned_int>(value.elementCount);
      local_90 = assertMax<unsigned_long,capnp::_::WireHelpers::setListPointer(capnp::_::SegmentBuilder*,capnp::_::CapTableBuilder*,capnp::_::WirePointer*,capnp::_::ListReader,capnp::_::BuilderArena*,bool)::_lambda()_2_>
                           (0xfffffff8,uVar7 * value.step >> 3,
                            (anon_class_1_0_00000001 *)((long)&leftoverBits + 7));
      copyMemory((byte *)pWVar8,value.ptr,(ByteCount32)local_90);
      uVar7 = upgradeBound<unsigned_long,unsigned_int>(value.elementCount);
      _dataSize = uVar7 * value.step & 7;
      if (_dataSize != 0) {
        uVar7 = unbound<unsigned_long>(_dataSize);
        *(byte *)((long)&(pWVar8->offsetAndKind).value + local_90) =
             (char)(1 << ((byte)uVar7 & 0x1f)) - 1U & value.ptr[local_90];
      }
    }
  }
  SVar1.value = (word *)local_10;
  SVar1.segment = (SegmentBuilder *)capTable_local;
  return SVar1;
}

Assistant:

static SegmentAnd<word*> setListPointer(
      SegmentBuilder* segment, CapTableBuilder* capTable, WirePointer* ref, ListReader value,
      BuilderArena* orphanArena = nullptr, bool canonical = false) {
    auto totalSize = assertMax<kj::maxValueForBits<SEGMENT_WORD_COUNT_BITS>() - 1>(
        roundBitsUpToWords(upgradeBound<uint64_t>(value.elementCount) * value.step),
        []() { KJ_FAIL_ASSERT("encountered impossibly long struct list ListReader"); });

    if (value.elementSize != ElementSize::INLINE_COMPOSITE) {
      // List of non-structs.
      word* ptr = allocate(ref, segment, capTable, totalSize, WirePointer::LIST, orphanArena);

      if (value.elementSize == ElementSize::POINTER) {
        // List of pointers.
        ref->listRef.set(ElementSize::POINTER, value.elementCount);
        for (auto i: kj::zeroTo(value.elementCount * (ONE * POINTERS / ELEMENTS))) {
          copyPointer(segment, capTable, reinterpret_cast<WirePointer*>(ptr) + i,
                      value.segment, value.capTable,
                      reinterpret_cast<const WirePointer*>(value.ptr) + i,
                      value.nestingLimit, nullptr, canonical);
        }
      } else {
        // List of data.
        ref->listRef.set(value.elementSize, value.elementCount);

        auto wholeByteSize =
          assertMax(MAX_SEGMENT_WORDS * BYTES_PER_WORD,
            upgradeBound<uint64_t>(value.elementCount) * value.step / BITS_PER_BYTE,
            []() { KJ_FAIL_ASSERT("encountered impossibly long data ListReader"); });
        copyMemory(reinterpret_cast<byte*>(ptr), value.ptr, wholeByteSize);
        auto leftoverBits =
          (upgradeBound<uint64_t>(value.elementCount) * value.step) % BITS_PER_BYTE;
        if (leftoverBits > ZERO * BITS) {
          // We need to copy a partial byte.
          uint8_t mask = (1 << unbound(leftoverBits / BITS)) - 1;
          *((reinterpret_cast<byte*>(ptr)) + wholeByteSize) = mask & *(value.ptr + wholeByteSize);
        }
      }

      return { segment, ptr };
    } else {
      // List of structs.
      StructDataWordCount declDataSize = value.structDataSize / BITS_PER_WORD;
      StructPointerCount declPointerCount = value.structPointerCount;

      StructDataWordCount dataSize = ZERO * WORDS;
      StructPointerCount ptrCount = ZERO * POINTERS;

      if (canonical) {
        for (auto i: kj::zeroTo(value.elementCount)) {
          auto element = value.getStructElement(i);

          // Truncate the data section
          auto data = element.getDataSectionAsBlob();
          auto end = data.end();
          while (end > data.begin() && end[-1] == 0) --end;
          dataSize = kj::max(dataSize, roundBytesUpToWords(
              intervalLength(data.begin(), end, MAX_STUCT_DATA_WORDS * BYTES_PER_WORD)));

          // Truncate pointer section
          const WirePointer* ptr = element.pointers + element.pointerCount;
          while (ptr > element.pointers && ptr[-1].isNull()) --ptr;
          ptrCount = kj::max(ptrCount,
              intervalLength(element.pointers, ptr, MAX_STRUCT_POINTER_COUNT));
        }
        auto newTotalSize = (dataSize + upgradeBound<uint64_t>(ptrCount) * WORDS_PER_POINTER)
            / ELEMENTS * value.elementCount;
        KJ_ASSERT(newTotalSize <= totalSize);  // we've only removed data!
        totalSize = assumeMax<kj::maxValueForBits<SEGMENT_WORD_COUNT_BITS>() - 1>(newTotalSize);
      } else {
        dataSize = declDataSize;
        ptrCount = declPointerCount;
      }

      KJ_DASSERT(value.structDataSize % BITS_PER_WORD == ZERO * BITS);
      word* ptr = allocate(ref, segment, capTable, totalSize + POINTER_SIZE_IN_WORDS,
                           WirePointer::LIST, orphanArena);
      ref->listRef.setInlineComposite(totalSize);

      WirePointer* tag = reinterpret_cast<WirePointer*>(ptr);
      tag->setKindAndInlineCompositeListElementCount(WirePointer::STRUCT, value.elementCount);
      tag->structRef.set(dataSize, ptrCount);
      word* dst = ptr + POINTER_SIZE_IN_WORDS;

      const word* src = reinterpret_cast<const word*>(value.ptr);
      for (auto i KJ_UNUSED: kj::zeroTo(value.elementCount)) {
        copyMemory(dst, src, dataSize);
        dst += dataSize;
        src += declDataSize;

        for (auto j: kj::zeroTo(ptrCount)) {
          copyPointer(segment, capTable, reinterpret_cast<WirePointer*>(dst) + j,
              value.segment, value.capTable, reinterpret_cast<const WirePointer*>(src) + j,
              value.nestingLimit, nullptr, canonical);
        }
        dst += ptrCount * WORDS_PER_POINTER;
        src += declPointerCount * WORDS_PER_POINTER;
      }

      return { segment, ptr };
    }
  }